

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGB1555ToYRow_C(uint8_t *src_argb1555,uint8_t *dst_y,int width)

{
  byte bVar1;
  int iVar2;
  int in_EDX;
  undefined1 *in_RSI;
  byte *in_RDI;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int local_18;
  undefined1 *local_10;
  byte *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    bVar1 = (byte)((int)(uint)*local_8 >> 5) | (local_8[1] & 3) << 3;
    iVar2 = libyuv::RGBToY((char)((int)(local_8[1] & 0x7c) >> 2) << 3 |
                           (byte)((int)(local_8[1] & 0x7c) >> 4),
                           bVar1 << 3 | (byte)((int)(uint)bVar1 >> 2),
                           (*local_8 & 0x1f) << 3 | (byte)((int)(uint)(*local_8 & 0x1f) >> 2));
    *local_10 = (char)iVar2;
    local_8 = local_8 + 2;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void ARGB1555ToYRow_C(const uint8_t* src_argb1555, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb1555[0] & 0x1f;
    uint8_t g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r = (src_argb1555[1] & 0x7c) >> 2;
    b = (b << 3) | (b >> 2);
    g = (g << 3) | (g >> 2);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_argb1555 += 2;
    dst_y += 1;
  }
}